

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::import_generator<flatbuffers::EnumDef>
          (DartGenerator *this,
          vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *definitions,
          string *included,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *imports)

{
  bool bVar1;
  __type _Var2;
  reference ppEVar3;
  ulong uVar4;
  bool local_1ea;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  byte local_1a2;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  byte local_11a;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string filename;
  string local_a8;
  undefined1 local_88 [8];
  string filebase;
  string component;
  EnumDef **item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *__range3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *imports_local;
  string *included_local;
  vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *definitions_local;
  DartGenerator *this_local;
  
  __end0 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                     (definitions);
  item = (EnumDef **)
         std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                   (definitions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                                     *)&item), bVar1) {
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&__end0);
    _Var2 = std::operator==(&((*ppEVar3)->super_Definition).file,included);
    if (_Var2) {
      IdlNamer::Namespace_abi_cxx11_
                ((string *)((long)&filebase.field_2 + 8),&this->namer_,
                 ((*ppEVar3)->super_Definition).defined_namespace);
      StripExtension(&local_a8,&((*ppEVar3)->super_Definition).file);
      StripPath((string *)local_88,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      uVar4 = std::__cxx11::string::empty();
      local_11a = 0;
      if ((uVar4 & 1) == 0) {
        std::operator+(&local_118,"_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&filebase.field_2 + 8));
      }
      else {
        std::allocator<char>::allocator();
        local_11a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
      }
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &local_118);
      Namer::File((string *)local_d8,&(this->namer_).super_Namer,&local_f8,None);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      if ((local_11a & 1) != 0) {
        std::allocator<char>::~allocator(&local_119);
      }
      std::operator+(&local_180,"import \'./",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      std::operator+(&local_160,&local_180,"\'");
      uVar4 = std::__cxx11::string::empty();
      local_1a2 = 0;
      local_1ea = (uVar4 & 1) != 0;
      if (local_1ea) {
        std::allocator<char>::allocator();
        local_1a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,";\n",&local_1a1);
      }
      else {
        ImportAliasName(&local_1e8,(string *)((long)&filebase.field_2 + 8));
        std::operator+(&local_1c8," as ",&local_1e8);
        std::operator+(&local_1a0,&local_1c8,";\n");
      }
      local_1ea = !local_1ea;
      std::operator+(&local_140,&local_160,&local_1a0);
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::emplace<std::__cxx11::string>
                ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)imports,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_1a0);
      if (local_1ea) {
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      if ((local_1a2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_1a1);
      }
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(filebase.field_2._M_local_buf + 8));
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void import_generator(const std::vector<T *> &definitions,
                        const std::string &included,
                        std::set<std::string> &imports) {
    for (const auto &item : definitions) {
      if (item->file == included) {
        std::string component = namer_.Namespace(*item->defined_namespace);
        std::string filebase =
            flatbuffers::StripPath(flatbuffers::StripExtension(item->file));
        std::string filename =
            namer_.File(filebase + (component.empty() ? "" : "_" + component));

        imports.emplace("import './" + filename + "'" +
                        (component.empty()
                             ? ";\n"
                             : " as " + ImportAliasName(component) + ";\n"));
      }
    }
  }